

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# permute.cpp
# Opt level: O2

int __thiscall ncnn::Permute::forward(Permute *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  size_t _elemsize;
  void *pvVar1;
  int i_3;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined4 *puVar6;
  uint uVar7;
  undefined4 *puVar8;
  undefined4 *puVar9;
  int i_1;
  long lVar10;
  ulong uVar11;
  int i;
  ulong uVar12;
  int j;
  uint _h;
  ulong uVar13;
  ulong uVar14;
  long local_b0;
  int local_a8;
  Mat local_70;
  ulong local_38;
  
  local_a8 = 0;
  if ((uint)this->order_type < 6) {
    uVar7 = bottom_blob->w;
    lVar10 = (long)(int)uVar7;
    _h = bottom_blob->h;
    uVar3 = bottom_blob->c;
    _elemsize = bottom_blob->elemsize;
    switch(this->order_type) {
    case 0:
      Mat::operator=(top_blob,bottom_blob);
      break;
    case 1:
      Mat::create(top_blob,_h,uVar7,uVar3,_elemsize,opt->blob_allocator);
      local_a8 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        local_a8 = 0;
        uVar5 = 0;
        if (0 < (int)_h) {
          uVar5 = (ulong)_h;
        }
        uVar13 = 0;
        if (0 < (int)uVar7) {
          uVar13 = (ulong)uVar7;
        }
        uVar7 = 0;
        if (0 < (int)uVar3) {
          uVar7 = uVar3;
        }
        for (uVar3 = 0; uVar3 != uVar7; uVar3 = uVar3 + 1) {
          Mat::channel(&local_70,bottom_blob,uVar3);
          puVar9 = (undefined4 *)local_70.data;
          Mat::~Mat(&local_70);
          Mat::channel(&local_70,top_blob,uVar3);
          puVar8 = (undefined4 *)local_70.data;
          Mat::~Mat(&local_70);
          for (uVar12 = 0; uVar12 != uVar13; uVar12 = uVar12 + 1) {
            puVar6 = puVar9;
            for (uVar11 = 0; uVar5 != uVar11; uVar11 = uVar11 + 1) {
              puVar8[uVar11] = *puVar6;
              puVar6 = puVar6 + lVar10;
            }
            puVar8 = puVar8 + (int)_h;
            puVar9 = puVar9 + 1;
          }
        }
      }
      break;
    case 2:
      Mat::create(top_blob,uVar7,uVar3,_h,_elemsize,opt->blob_allocator);
      local_a8 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        uVar5 = 0;
        if (0 < (int)uVar7) {
          uVar5 = (ulong)uVar7;
        }
        if ((int)uVar3 < 1) {
          uVar3 = 0;
        }
        local_a8 = 0;
        if ((int)_h < 1) {
          _h = 0;
        }
        for (uVar7 = 0; uVar7 != _h; uVar7 = uVar7 + 1) {
          Mat::channel(&local_70,top_blob,uVar7);
          puVar9 = (undefined4 *)local_70.data;
          Mat::~Mat(&local_70);
          for (uVar13 = 0; uVar13 != uVar3; uVar13 = uVar13 + 1) {
            Mat::channel(&local_70,bottom_blob,(int)uVar13);
            pvVar1 = local_70.data;
            iVar2 = local_70.w * uVar7;
            Mat::~Mat(&local_70);
            for (uVar12 = 0; uVar5 != uVar12; uVar12 = uVar12 + 1) {
              puVar9[uVar12] = *(undefined4 *)((long)pvVar1 + ((long)iVar2 + uVar12) * 4);
            }
            puVar9 = puVar9 + lVar10;
          }
        }
      }
      break;
    case 3:
      Mat::create(top_blob,uVar3,uVar7,_h,_elemsize,opt->blob_allocator);
      local_a8 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        uVar5 = 0;
        if (0 < (int)uVar3) {
          uVar5 = (ulong)uVar3;
        }
        uVar13 = 0;
        if (0 < (int)uVar7) {
          uVar13 = (ulong)uVar7;
        }
        local_a8 = 0;
        if ((int)_h < 1) {
          _h = 0;
        }
        for (uVar7 = 0; uVar7 != _h; uVar7 = uVar7 + 1) {
          Mat::channel(&local_70,top_blob,uVar7);
          puVar9 = (undefined4 *)local_70.data;
          Mat::~Mat(&local_70);
          for (uVar12 = 0; uVar12 != uVar13; uVar12 = uVar12 + 1) {
            for (uVar11 = 0; uVar5 != uVar11; uVar11 = uVar11 + 1) {
              Mat::channel(&local_70,bottom_blob,(int)uVar11);
              pvVar1 = local_70.data;
              lVar10 = (long)local_70.w;
              Mat::~Mat(&local_70);
              puVar9[uVar11] = *(undefined4 *)((long)pvVar1 + (lVar10 * (int)uVar7 + uVar12) * 4);
            }
            puVar9 = puVar9 + (int)uVar3;
          }
        }
      }
      break;
    case 4:
      Mat::create(top_blob,_h,uVar3,uVar7,_elemsize,opt->blob_allocator);
      local_a8 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        local_a8 = 0;
        uVar5 = 0;
        if (0 < (int)_h) {
          uVar5 = (ulong)_h;
        }
        uVar13 = 0;
        if (0 < (int)uVar3) {
          uVar13 = (ulong)uVar3;
        }
        uVar12 = 0;
        if (0 < (int)uVar7) {
          uVar12 = (ulong)uVar7;
        }
        local_b0 = 0;
        for (uVar11 = 0; uVar11 != uVar12; uVar11 = uVar11 + 1) {
          Mat::channel(&local_70,top_blob,(int)uVar11);
          puVar9 = (undefined4 *)local_70.data;
          Mat::~Mat(&local_70);
          for (uVar14 = 0; uVar14 != uVar13; uVar14 = uVar14 + 1) {
            Mat::channel(&local_70,bottom_blob,(int)uVar14);
            puVar8 = (undefined4 *)((long)local_70.data + local_b0);
            Mat::~Mat(&local_70);
            for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
              puVar9[uVar4] = *puVar8;
              puVar8 = puVar8 + lVar10;
            }
            puVar9 = puVar9 + (int)_h;
          }
          local_b0 = local_b0 + 4;
        }
      }
      break;
    case 5:
      Mat::create(top_blob,uVar3,_h,uVar7,_elemsize,opt->blob_allocator);
      local_a8 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        uVar5 = 0;
        if (0 < (int)uVar3) {
          uVar5 = (ulong)uVar3;
        }
        local_a8 = 0;
        uVar13 = (ulong)_h;
        if ((int)_h < 1) {
          uVar13 = 0;
        }
        local_38 = 0;
        if (0 < (int)uVar7) {
          local_38 = (ulong)uVar7;
        }
        for (uVar12 = 0; uVar12 != local_38; uVar12 = uVar12 + 1) {
          Mat::channel(&local_70,top_blob,(int)uVar12);
          puVar9 = (undefined4 *)local_70.data;
          Mat::~Mat(&local_70);
          for (uVar11 = 0; uVar11 != uVar13; uVar11 = uVar11 + 1) {
            for (uVar14 = 0; uVar5 != uVar14; uVar14 = uVar14 + 1) {
              Mat::channel(&local_70,bottom_blob,(int)uVar14);
              pvVar1 = local_70.data;
              Mat::~Mat(&local_70);
              puVar9[uVar14] = *(undefined4 *)((long)pvVar1 + (uVar11 * lVar10 + uVar12) * 4);
            }
            puVar9 = puVar9 + (int)uVar3;
          }
        }
      }
    }
  }
  return local_a8;
}

Assistant:

int Permute::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    // order_type
    // 0 = w h c
    // 1 = h w c
    // 2 = w c h
    // 3 = c w h
    // 4 = h c w
    // 5 = c h w

    if (order_type == 0)
    {
        top_blob = bottom_blob;
    }
    else if (order_type == 1)
    {
        top_blob.create(h, w, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < w; i++)
            {
                for (int j = 0; j < h; j++)
                {
                    outptr[i*h + j] = ptr[j*w + i];
                }
            }
        }
    }
    else if (order_type == 2)
    {
        top_blob.create(w, channels, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<h; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < channels; i++)
            {
                const float* ptr = bottom_blob.channel(i).row(q);

                for (int j = 0; j < w; j++)
                {
                    outptr[i*w + j] = ptr[j];
                }
            }
        }
    }
    else if (order_type == 3)
    {
        top_blob.create(channels, w, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<h; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < w; i++)
            {
                for (int j = 0; j < channels; j++)
                {
                    const float* ptr = bottom_blob.channel(j).row(q);

                    outptr[i*channels + j] = ptr[i];
                }
            }
        }
    }
    else if (order_type == 4)
    {
        top_blob.create(h, channels, w, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<w; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < channels; i++)
            {
                const float* ptr = bottom_blob.channel(i);

                for (int j = 0; j < h; j++)
                {
                    outptr[i*h + j] = ptr[j*w + q];
                }
            }
        }
    }
    else if (order_type == 5)
    {
        top_blob.create(channels, h, w, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<w; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < channels; j++)
                {
                    const float* ptr = bottom_blob.channel(j);

                    outptr[i*channels + j] = ptr[i*w + q];
                }
            }
        }
    }

    return 0;
}